

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v9::sprintf<char[46],char[4608],char[4608],int,int,char>
          (char (*fmt) [46],char (*args) [4608],char (*args_1) [4608],int *args_2,int *args_3)

{
  char (*in_RCX) [4608];
  v9 *in_RDX;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char (*in_R8) [4608];
  int *in_R9;
  basic_string_view<char> *in_stack_00000188;
  undefined1 in_stack_00000190 [16];
  format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_int,_int>
  local_e8;
  undefined8 local_a8;
  format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_int,_int>
  *local_a0;
  undefined8 local_98;
  size_t local_90;
  int *local_88;
  char (*local_80) [4608];
  char (*local_78) [4608];
  v9 *local_70;
  undefined8 local_50 [3];
  undefined8 *local_38;
  format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_int,_int>
  *local_30;
  undefined8 *local_28;
  format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_int,_int>
  *local_20;
  format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[4608],_char[4608],_int,_int>
  *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_38 = local_50;
  local_88 = in_R9;
  local_80 = in_R8;
  local_78 = in_RCX;
  local_70 = in_RDX;
  local_50[0] = in_RSI;
  local_90 = std::char_traits<char>::length((char_type *)0x64cdb9);
  local_98 = local_50[0];
  make_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,char>,char_const(&)[4608],char_const(&)[4608],int_const&,int_const&>
            (&local_e8,local_70,local_78,local_80,local_88,in_R9);
  local_28 = &local_a8;
  local_30 = &local_e8;
  local_10 = 0x11cc;
  local_a8 = 0x11cc;
  local_20 = local_30;
  local_18 = local_30;
  local_8 = local_28;
  local_a0 = local_30;
  vsprintf<fmt::v9::basic_string_view<char>,char>
            (in_stack_00000188,
             (basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>)
             in_stack_00000190);
  return in_RDI;
}

Assistant:

inline auto sprintf(const S& fmt, const T&... args) -> std::basic_string<Char> {
  using context = basic_printf_context_t<Char>;
  return vsprintf(detail::to_string_view(fmt),
                  fmt::make_format_args<context>(args...));
}